

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

uint64_t __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::ext_tag
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  uint uVar1;
  
  while (uVar1 = *(byte *)&this->field_0 & 0xf, uVar1 - 8 < 2) {
    this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
            ((long)&this->field_0 + 8);
  }
  if (uVar1 == 0xc) {
    return **(uint64_t **)((long)&this->field_0 + 8);
  }
  return 0;
}

Assistant:

uint64_t ext_tag() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::byte_str:
                {
                    return cast<byte_string_storage>().ext_tag();
                }
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().ext_tag();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().ext_tag();
                default:
                    return 0;
            }
        }